

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monster.c
# Opt level: O3

int access_monster_buffer(void *buffer)

{
  int *piVar1;
  float fVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  int *piVar9;
  long lVar10;
  long lVar11;
  ushort *puVar12;
  char *pcVar13;
  long lVar14;
  bool bVar15;
  bool bVar16;
  bool bVar17;
  
  if (buffer == (void *)0x0) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xd3,"int access_monster_buffer(const void *)");
  }
  uVar6 = (ulong)*buffer;
  lVar14 = -(long)*(int *)((long)buffer + uVar6);
  uVar3 = *(ushort *)((long)buffer + (uVar6 - (long)*(int *)((long)buffer + uVar6)));
  if (uVar3 < 10) {
    if (uVar3 < 8) goto LAB_00103c5f;
LAB_00103952:
    bVar15 = false;
  }
  else {
    uVar7 = (ulong)*(ushort *)((long)buffer + lVar14 + uVar6 + 8);
    if (uVar7 == 0) goto LAB_00103952;
    bVar15 = *(short *)((long)buffer + uVar7 + uVar6) == 300;
  }
  uVar7 = (ulong)*(ushort *)((long)buffer + lVar14 + uVar6 + 6);
  if (uVar7 == 0) {
    bVar16 = true;
  }
  else {
    bVar16 = *(short *)((long)buffer + uVar7 + uVar6) == 0x96;
  }
  if ((uVar3 < 0xc) || (uVar8 = (ulong)*(ushort *)((long)buffer + lVar14 + uVar6 + 10), uVar8 == 0))
  {
    piVar9 = (int *)0x0;
    bVar17 = false;
  }
  else {
    piVar1 = (int *)((long)buffer + (ulong)*(uint *)((long)buffer + uVar8 + uVar6) + uVar8 + uVar6);
    piVar9 = piVar1 + 1;
    bVar17 = *piVar1 == 3;
  }
  if (bVar15) {
    if (!bVar16) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0xdd,"int access_monster_buffer(const void *)");
    }
    iVar5 = strcmp((char *)piVar9,"Orc");
    if (iVar5 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0xde,"int access_monster_buffer(const void *)");
    }
    if (!bVar17) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0xdf,"int access_monster_buffer(const void *)");
    }
    if ((uVar3 < 10) || (*(short *)((long)buffer + lVar14 + uVar6 + 8) == 0)) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0xe3,"int access_monster_buffer(const void *)");
    }
    if (uVar7 != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0xe4,"int access_monster_buffer(const void *)");
    }
    uVar4 = *(ushort *)((long)buffer + lVar14 + uVar6 + 4);
    if (uVar4 == 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0xe8,"int access_monster_buffer(const void *)");
    }
    uVar7 = (ulong)uVar4;
    fVar2 = *(float *)((long)buffer + uVar7 + uVar6);
    if ((fVar2 != 1.0) || (NAN(fVar2))) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0xf0,"int access_monster_buffer(const void *)");
    }
    fVar2 = *(float *)((long)buffer + uVar7 + uVar6 + 4);
    if ((fVar2 == 2.0) && (!NAN(fVar2))) {
      fVar2 = *(float *)((long)buffer + uVar7 + uVar6 + 8);
      if ((fVar2 != 3.0) || (NAN(fVar2))) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                      ,0xf2,"int access_monster_buffer(const void *)");
      }
      if ((uVar3 < 0x10) ||
         (uVar7 = (ulong)*(ushort *)((long)buffer + lVar14 + uVar6 + 0xe), uVar7 == 0)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                      ,0x105,"int access_monster_buffer(const void *)");
      }
      uVar8 = (ulong)*(uint *)((long)buffer + uVar7 + uVar6);
      if (*(int *)((long)buffer + uVar8 + uVar7 + uVar6) != 10) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                      ,0x107,"int access_monster_buffer(const void *)");
      }
      if (*(char *)((long)buffer + uVar8 + uVar7 + uVar6 + 6) != '\x02') {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                      ,0x10b,"int access_monster_buffer(const void *)");
      }
      if ((0x13 < uVar3) &&
         (uVar7 = (ulong)*(ushort *)((long)buffer + lVar14 + uVar6 + 0x12), uVar7 != 0)) {
        uVar8 = (ulong)*(uint *)((long)buffer + uVar7 + uVar6);
        if (*(int *)((long)buffer + uVar8 + uVar7 + uVar6) == 2) {
          lVar11 = uVar8 + uVar7 + uVar6;
          lVar11 = (ulong)*(uint *)((long)buffer + lVar11 + 8) + lVar11;
          piVar9 = (int *)((long)buffer + lVar11 + 8);
          uVar4 = *(ushort *)((long)piVar9 - (long)*piVar9);
          if (5 < uVar4) {
            lVar10 = -(long)*piVar9;
            uVar7 = (ulong)*(ushort *)((long)buffer + lVar10 + lVar11 + 0xc);
            if (uVar7 == 0) {
              pcVar13 = (char *)0x0;
            }
            else {
              pcVar13 = (char *)((long)piVar9 + *(uint *)((long)piVar9 + uVar7) + uVar7 + 4);
            }
            if ((uVar4 < 8) ||
               (uVar7 = (ulong)*(ushort *)((long)buffer + lVar10 + lVar11 + 0xe), uVar7 == 0)) {
              bVar15 = false;
            }
            else {
              bVar15 = *(short *)((long)piVar9 + uVar7) == 5;
            }
            if (pcVar13 != (char *)0x0) {
              iVar5 = strcmp(pcVar13,"Axe");
              if (iVar5 == 0) {
                if (!bVar15) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                                ,0x114,"int access_monster_buffer(const void *)");
                }
                if (((0x15 < uVar3) &&
                    (uVar7 = (ulong)*(ushort *)((long)buffer + lVar14 + uVar6 + 0x14), uVar7 != 0))
                   && (*(char *)((long)buffer + uVar7 + uVar6) == '\x01')) {
                  if ((uVar3 < 0x18) ||
                     (uVar7 = (ulong)*(ushort *)((long)buffer + lVar14 + uVar6 + 0x16), uVar7 == 0))
                  {
                    __assert_fail("t__tmp != 0 && \"null pointer table access\"",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/build_O3/samples/monster/generated/monster_reader.h"
                                  ,0xab,
                                  "flatbuffers_string_t MyGame_Sample_Weapon_name(MyGame_Sample_Weapon_table_t)"
                                 );
                  }
                  uVar8 = (ulong)*(uint *)((long)buffer + uVar7 + uVar6);
                  lVar14 = uVar8 + uVar7 + uVar6;
                  lVar11 = (long)*(int *)((long)buffer + uVar8 + uVar7 + uVar6);
                  puVar12 = (ushort *)((long)buffer + (lVar14 - lVar11));
                  uVar6 = (ulong)puVar12[2];
                  if (uVar6 == 0) {
                    pcVar13 = (char *)0x0;
                  }
                  else {
                    pcVar13 = (char *)((long)buffer +
                                      (ulong)*(uint *)((long)buffer + uVar6 + lVar14) +
                                      uVar6 + lVar14 + 4);
                  }
                  if ((*puVar12 < 8) ||
                     (uVar6 = (ulong)*(ushort *)((long)buffer + ((lVar14 + 6) - lVar11)), uVar6 == 0
                     )) {
                    bVar15 = false;
                  }
                  else {
                    bVar15 = *(short *)((long)buffer + uVar6 + lVar14) == 5;
                  }
                  iVar5 = strcmp(pcVar13,"Axe");
                  if (iVar5 != 0) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                                  ,0x11e,"int access_monster_buffer(const void *)");
                  }
                  if (!bVar15) {
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                                  ,0x11f,"int access_monster_buffer(const void *)");
                  }
                }
                return 0;
              }
            }
          }
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                        ,0x113,"int access_monster_buffer(const void *)");
        }
      }
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                    ,0x10f,"int access_monster_buffer(const void *)");
    }
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                  ,0xf1,"int access_monster_buffer(const void *)");
  }
LAB_00103c5f:
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/dvidelabs[P]flatcc/samples/monster/monster.c"
                ,0xdb,"int access_monster_buffer(const void *)");
}

Assistant:

int access_monster_buffer(const void *buffer)
{
    // Note that we use the `table_t` suffix when reading a table object
    // as opposed to the `ref_t` suffix used during the construction of
    // the buffer.
    ns(Monster_table_t) monster = ns(Monster_as_root(buffer));

    // Note: root object pointers are NOT the same as the `buffer` pointer.

    // Make sure the buffer is accessible.
    test_assert(monster != 0);

    int16_t hp = ns(Monster_hp(monster));
    int16_t mana = ns(Monster_mana(monster));
    // This is just a const char *, but it also supports a fast length operation.
    flatbuffers_string_t name = ns(Monster_name(monster));
    size_t name_len = flatbuffers_string_len(name);

    test_assert(hp == 300);
    // Since 150 is the default, we are reading a value that wasn't stored.
    test_assert(mana == 150);
    test_assert(0 == strcmp(name, "Orc"));
    test_assert(name_len == strlen("Orc"));

    int hp_present = ns(Monster_hp_is_present(monster)); // 1
    int mana_present = ns(Monster_mana_is_present(monster)); // 0
    test_assert(hp_present);
    test_assert(!mana_present);

    ns(Vec3_struct_t) pos = ns(Monster_pos(monster));
    // Make sure pos has been set.
    test_assert(pos != 0);
    float x = ns(Vec3_x(pos));
    float y = ns(Vec3_y(pos));
    float z = ns(Vec3_z(pos));

    // The literal `f` suffix is important because double literals does
    // not always map cleanly to 32-bit represention even with only a few digits:
    // `1.0 == 1.0f`, but `3.2 != 3.2f`.
    test_assert(x == 1.0f);
    test_assert(y == 2.0f);
    test_assert(z == 3.0f);

    // We can also read the position into a C-struct. We have to copy
    // because we generally do not know if the native endian format
    // matches the one stored in the buffer (pe: protocol endian).
    ns(Vec3_t) pos_vec;
    // `pe` indicates endian conversion from protocol to native.
    ns(Vec3_copy_from_pe(&pos_vec, pos));
    test_assert(pos_vec.x == 1.0f);
    test_assert(pos_vec.y == 2.0f);
    test_assert(pos_vec.z == 3.0f);

    // This is a const uint8_t *, but it shouldn't be accessed directly
    // to ensure proper endian conversion. However, uint8 (ubyte) are
    // not sensitive endianness, so we *could* have accessed it directly.
    // The compiler likely optimizes this so that it doesn't matter.
    flatbuffers_uint8_vec_t inv = ns(Monster_inventory(monster));
    size_t inv_len = flatbuffers_uint8_vec_len(inv);
    // Make sure the inventory has been set.
    test_assert(inv != 0);
    // If `inv` were absent, the length would 0, so the above test is redundant.
    test_assert(inv_len == 10);
    // Index 0 is the first, index 2 is the third.
    // NOTE: C++ uses the `Get` terminology for vector elemetns, C use `at`.
    uint8_t third_item = flatbuffers_uint8_vec_at(inv, 2);
    test_assert(third_item == 2);

    ns(Weapon_vec_t) weapons = ns(Monster_weapons(monster));
    size_t weapons_len = ns(Weapon_vec_len(weapons));
    test_assert(weapons_len == 2);
    // We can use `const char *` instead of `flatbuffers_string_t`.
    const char *second_weapon_name = ns(Weapon_name(ns(Weapon_vec_at(weapons, 1))));
    int16_t second_weapon_damage =  ns(Weapon_damage(ns(Weapon_vec_at(weapons, 1))));
    test_assert(second_weapon_name != 0 && strcmp(second_weapon_name, "Axe") == 0);
    test_assert(second_weapon_damage == 5);

    // Access union type field.
    if (ns(Monster_equipped_type(monster)) == ns(Equipment_Weapon)) {
        // Cast to appropriate type:
        // C does not require the cast to Weapon_table_t, but C++ does.
        ns(Weapon_table_t) weapon = (ns(Weapon_table_t)) ns(Monster_equipped(monster));
        const char *weapon_name = ns(Weapon_name(weapon));
        int16_t weapon_damage = ns(Weapon_damage(weapon));

        test_assert(0 == strcmp(weapon_name, "Axe"));
        test_assert(weapon_damage == 5);
    }
    return 0;
}